

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_readOEsingle(ecx_contextt *context,uint16 Item,uint8 SubI,ec_ODlistt *pODlist,
                    ec_OElistt *pOElist)

{
  uint16 Index;
  ushort uVar1;
  uint8 uVar2;
  uint uVar3;
  ushort uVar4;
  undefined6 in_register_00000032;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  
  uVar4 = pODlist->Slave;
  Index = pODlist->Index[CONCAT62(in_register_00000032,Item) & 0xffffffff];
  ec_clearmbx(&MbxIn);
  ecx_mbxreceive(context,uVar4,&MbxIn,0);
  ec_clearmbx(&MbxOut);
  MbxOut[0] = '\n';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut[4] = '\0';
  uVar2 = ec_nextmbxcnt(context->slavelist[uVar4].mbx_cnt);
  context->slavelist[uVar4].mbx_cnt = uVar2;
  MbxOut[5] = uVar2 << 4 | 3;
  MbxOut[6] = '\0';
  MbxOut[7] = 0x80;
  MbxOut[8] = '\x05';
  MbxOut[9] = '\0';
  MbxOut[10] = '\0';
  MbxOut[0xb] = '\0';
  MbxOut[0xf] = '\a';
  MbxOut._12_2_ = Index;
  MbxOut[0xe] = SubI;
  uVar3 = ecx_mbxsend(context,uVar4,&MbxOut,20000);
  if ((short)uVar3 != 0) {
    ec_clearmbx(&MbxIn);
    uVar3 = ecx_mbxreceive(context,uVar4,&MbxIn,700000);
    if ((short)uVar3 != 0) {
      if ((MbxIn[8] & 0x7f) == 6 && (MbxIn[5] & 0xf) == 3) {
        pOElist->Entries = pOElist->Entries + 1;
        uVar4 = 0x28;
        if ((short)(MbxIn._0_2_ - 0x10) < 0x28) {
          uVar4 = MbxIn._0_2_ - 0x10;
        }
        uVar1 = 0;
        if (0 < (short)uVar4) {
          uVar1 = uVar4;
        }
        pOElist->ValueInfo[SubI] = MbxIn[0xf];
        pOElist->DataType[SubI] = MbxIn._16_2_;
        pOElist->BitLength[SubI] = MbxIn._18_2_;
        pOElist->ObjAccess[SubI] = MbxIn._20_2_;
        strncpy(pOElist->Name[SubI],(char *)(MbxIn + 0x16),(ulong)uVar1);
        pOElist->Name[SubI][uVar1] = '\0';
      }
      else {
        if ((MbxIn[8] & 0x7f) == 7) {
          ecx_SDOinfoerror(context,uVar4,Index,SubI,MbxIn._12_4_);
        }
        else {
          ecx_packeterror(context,uVar4,Index,SubI,1);
        }
        uVar3 = 0;
      }
    }
  }
  return uVar3 & 0xffff;
}

Assistant:

int ecx_readOEsingle(ecx_contextt *context, uint16 Item, uint8 SubI, ec_ODlistt *pODlist, ec_OElistt *pOElist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   uint16 wkc, Index, Slave;
   int16 n;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   wkc = 0;
   Slave = pODlist->Slave;
   Index = pODlist->Index[Item];
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x000a);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OE_REQ; /* get object entry description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0;      /* fragments left */
   SDOp->wdata[0] = htoes(Index);      /* Index */
   SDOp->bdata[2] = SubI;       /* SubIndex */
   SDOp->bdata[3] = 1 + 2 + 4; /* get access rights, object category, PDO */
   /* send get object entry description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode &  0x7f) == ECT_GET_OE_RES))
         {
            pOElist->Entries++;
            n = (etohs(aSDOp->MbxHeader.length) - 16); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max string length */
            }
            if (n < 0 )
            {
               n = 0;
            }
            pOElist->ValueInfo[SubI] = aSDOp->bdata[3];
            pOElist->DataType[SubI] = etohs(aSDOp->wdata[2]);
            pOElist->BitLength[SubI] = etohs(aSDOp->wdata[3]);
            pOElist->ObjAccess[SubI] = etohs(aSDOp->wdata[4]);

            strncpy(pOElist->Name[SubI] , (char *)&aSDOp->wdata[5], n);
            pOElist->Name[SubI][n] = 0x00; /* string terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave, Index, SubI, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave, Index, SubI, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
   
   return wkc;
}